

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.hpp
# Opt level: O1

void __thiscall
de::PoolArray<vkt::(anonymous_namespace)::Program,_8U>::resize
          (PoolArray<vkt::(anonymous_namespace)::Program,_8U> *this,deUintptr newSize)

{
  deUintptr val_1;
  void **ppvVar1;
  void **ppvVar2;
  ulong uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  ProgramIdentifier *this_00;
  deUintptr val;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  string local_70;
  string local_50;
  
  uVar9 = this->m_numElements;
  if (newSize < uVar9) {
    uVar9 = newSize;
    if (newSize < this->m_numElements) {
      do {
        vkt::anon_unknown_0::Program::~Program
                  ((Program *)
                   ((ulong)(((uint)uVar9 & 0xf) * 0xa0) + (long)this->m_pageTable[uVar9 >> 4]));
        uVar9 = uVar9 + 1;
      } while (uVar9 < this->m_numElements);
    }
    this->m_numElements = newSize;
  }
  else if (uVar9 < newSize) {
    if (this->m_capacity <= newSize) {
      uVar8 = newSize + 0xf >> 4;
      uVar6 = 0;
      ppvVar1 = (void **)0x0;
      if (this->m_pageTableCapacity < uVar8) {
        uVar10 = this->m_pageTableCapacity * 2;
        if (uVar10 <= uVar8) {
          uVar10 = uVar8;
        }
        ppvVar2 = (void **)deMemPool_alloc(this->m_pool->m_pool,(long)(uVar10 << 0x23) >> 0x20);
        if (ppvVar2 == (void **)0x0) {
LAB_00389047:
          puVar4 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar4 = time;
          __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        uVar6 = this->m_pageTableCapacity;
        if (uVar6 == 0) {
          uVar5 = 0;
        }
        else {
          uVar3 = 0;
          do {
            ppvVar2[uVar3] = this->m_pageTable[uVar3];
            uVar3 = uVar3 + 1;
            uVar5 = uVar6;
          } while (uVar6 != uVar3);
        }
        if (uVar5 < uVar10) {
          memset(ppvVar2 + uVar6,0,(uVar10 - uVar6) * 8);
        }
        ppvVar1 = this->m_pageTable;
        uVar6 = uVar6 << 3;
        this->m_pageTable = ppvVar2;
        this->m_pageTableCapacity = uVar10;
      }
      uVar10 = this->m_capacity >> 4;
      while( true ) {
        pvVar7 = (void *)((long)ppvVar1 + 7U & 0xfffffffffffffff8);
        uVar5 = (long)pvVar7 + (0xa00 - (long)ppvVar1);
        bVar11 = uVar6 < uVar5;
        uVar6 = uVar6 - uVar5;
        if (bVar11) break;
        this->m_pageTable[uVar10] = pvVar7;
        uVar10 = uVar10 + 1;
        ppvVar1 = (void **)((long)pvVar7 + 0xa00);
      }
      if (uVar10 < uVar8) {
        do {
          pvVar7 = deMemPool_alignedAlloc(this->m_pool->m_pool,0xa00,8);
          if (pvVar7 == (void *)0x0) goto LAB_00389047;
          this->m_pageTable[uVar10] = pvVar7;
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      this->m_capacity = uVar10 << 4;
    }
    this->m_numElements = newSize;
    if (uVar9 < newSize) {
      do {
        this_00 = (ProgramIdentifier *)
                  ((ulong)(((uint)uVar9 & 0xf) * 0xa0) + (long)this->m_pageTable[uVar9 >> 4]);
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::vk::BinaryRegistryDetail::ProgramIdentifier::ProgramIdentifier
                  (this_00,&local_50,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                   local_50.field_2._M_local_buf[0]) + 1);
        }
        *(undefined4 *)&this_00[1].testCasePath._M_dataplus._M_p = 0;
        this_00[1].testCasePath._M_string_length =
             (size_type)((long)&this_00[1].testCasePath.field_2 + 8);
        this_00[1].testCasePath.field_2._M_allocated_capacity = 0;
        this_00[1].testCasePath.field_2._M_local_buf[8] = '\0';
        this_00[1].programName._M_string_length = 0;
        this_00[1].programName.field_2._M_allocated_capacity = 0;
        *(undefined4 *)((long)&this_00[1].programName.field_2 + 8) = 0;
        this_00[2].testCasePath._M_dataplus._M_p = (pointer)&this_00[2].testCasePath.field_2;
        this_00[2].testCasePath._M_string_length = 0;
        this_00[2].testCasePath.field_2._M_local_buf[0] = '\0';
        uVar9 = uVar9 + 1;
      } while (uVar9 < this->m_numElements);
    }
  }
  return;
}

Assistant:

inline void PoolArray<T, Alignment>::resize (deUintptr newSize)
{
	if (newSize < m_numElements)
	{
		// Destruct elements that are no longer active.
		for (deUintptr ndx = newSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::destruct(getPtr(ndx));

		m_numElements = newSize;
	}
	else if (newSize > m_numElements)
	{
		deUintptr prevSize = m_numElements;

		reserve(newSize);
		m_numElements = newSize;

		// Fill new elements with default values
		for (deUintptr ndx = prevSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::constructDefault(getPtr(ndx));
	}
}